

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::resize(Fl_Group *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  Fl_Widget *pFVar11;
  int local_88;
  int local_84;
  int B;
  int YY;
  int R;
  int XX;
  Fl_Widget *o_1;
  Fl_Widget **ppFStack_68;
  int i_1;
  Fl_Widget **a_1;
  int IB;
  int IY;
  int IR;
  int IX;
  Fl_Widget *o;
  Fl_Widget **ppFStack_40;
  int i;
  Fl_Widget **a;
  int *p;
  int dh;
  int dw;
  int dy;
  int dx;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Group *this_local;
  
  iVar4 = Fl_Widget::x(&this->super_Fl_Widget);
  iVar5 = Fl_Widget::y(&this->super_Fl_Widget);
  iVar6 = Fl_Widget::w(&this->super_Fl_Widget);
  iVar7 = Fl_Widget::h(&this->super_Fl_Widget);
  piVar10 = sizes(this);
  Fl_Widget::resize(&this->super_Fl_Widget,X,Y,W,H);
  pFVar11 = resizable(this);
  if ((pFVar11 == (Fl_Widget *)0x0) || ((W == iVar6 && (H == iVar7)))) {
    bVar3 = Fl_Widget::type(&this->super_Fl_Widget);
    if (bVar3 < 0xf0) {
      ppFStack_40 = array(this);
      o._4_4_ = this->children_;
      while (o._4_4_ != 0) {
        pFVar11 = *ppFStack_40;
        iVar6 = Fl_Widget::x(pFVar11);
        iVar7 = Fl_Widget::y(pFVar11);
        uVar8 = Fl_Widget::w(pFVar11);
        uVar9 = Fl_Widget::h(pFVar11);
        (*pFVar11->_vptr_Fl_Widget[4])
                  (pFVar11,(ulong)(uint)(iVar6 + (X - iVar4)),(ulong)(uint)(iVar7 + (Y - iVar5)),
                   (ulong)uVar8,(ulong)uVar9);
        o._4_4_ = o._4_4_ + -1;
        ppFStack_40 = ppFStack_40 + 1;
      }
    }
  }
  else if (this->children_ != 0) {
    dw = X - *piVar10;
    iVar4 = W - (piVar10[1] - *piVar10);
    dh = Y - piVar10[2];
    iVar5 = H - (piVar10[3] - piVar10[2]);
    bVar3 = Fl_Widget::type(&this->super_Fl_Widget);
    if (0xef < bVar3) {
      dh = 0;
      dw = 0;
    }
    iVar6 = piVar10[4];
    iVar7 = piVar10[5];
    iVar1 = piVar10[6];
    a = (Fl_Widget **)(piVar10 + 8);
    iVar2 = piVar10[7];
    ppFStack_68 = array(this);
    o_1._4_4_ = this->children_;
    while (o_1._4_4_ != 0) {
      YY = *(int *)a;
      if (YY < iVar7) {
        if (iVar6 < YY) {
          YY = iVar6 + ((YY - iVar6) * ((iVar7 + iVar4) - iVar6) + (iVar7 - iVar6) / 2) /
                       (iVar7 - iVar6);
        }
      }
      else {
        YY = iVar4 + YY;
      }
      B = *(int *)((long)a + 4);
      if (B < iVar7) {
        if (iVar6 < B) {
          B = iVar6 + ((B - iVar6) * ((iVar7 + iVar4) - iVar6) + (iVar7 - iVar6) / 2) /
                      (iVar7 - iVar6);
        }
      }
      else {
        B = iVar4 + B;
      }
      piVar10 = (int *)((long)a + 0xc);
      local_84 = *(int *)(a + 1);
      if (local_84 < iVar2) {
        if (iVar1 < local_84) {
          local_84 = iVar1 + ((local_84 - iVar1) * ((iVar2 + iVar5) - iVar1) + (iVar2 - iVar1) / 2)
                             / (iVar2 - iVar1);
        }
      }
      else {
        local_84 = iVar5 + local_84;
      }
      a = a + 2;
      local_88 = *piVar10;
      if (local_88 < iVar2) {
        if (iVar1 < local_88) {
          local_88 = iVar1 + ((local_88 - iVar1) * ((iVar2 + iVar5) - iVar1) + (iVar2 - iVar1) / 2)
                             / (iVar2 - iVar1);
        }
      }
      else {
        local_88 = iVar5 + local_88;
      }
      (*(*ppFStack_68)->_vptr_Fl_Widget[4])
                (*ppFStack_68,(ulong)(uint)(YY + dw),(ulong)(uint)(local_84 + dh),
                 (ulong)(uint)(B - YY),(ulong)(uint)(local_88 - local_84));
      o_1._4_4_ = o_1._4_4_ + -1;
      ppFStack_68 = ppFStack_68 + 1;
    }
  }
  return;
}

Assistant:

void Fl_Group::resize(int X, int Y, int W, int H) {

  int dx = X-x();
  int dy = Y-y();
  int dw = W-w();
  int dh = H-h();
  
  int *p = sizes(); // save initial sizes and positions

  Fl_Widget::resize(X,Y,W,H); // make new xywh values visible for children

  if (!resizable() || (dw==0 && dh==0) ) {

    if (type() < FL_WINDOW) {
      Fl_Widget*const* a = array();
      for (int i=children_; i--;) {
	Fl_Widget* o = *a++;
	o->resize(o->x()+dx, o->y()+dy, o->w(), o->h());
      }
    }

  } else if (children_) {

    // get changes in size/position from the initial size:
    dx = X - p[0];
    dw = W - (p[1]-p[0]);
    dy = Y - p[2];
    dh = H - (p[3]-p[2]);
    if (type() >= FL_WINDOW) dx = dy = 0;
    p += 4;

    // get initial size of resizable():
    int IX = *p++;
    int IR = *p++;
    int IY = *p++;
    int IB = *p++;

    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
#if 1
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX = IX+((XX-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = IX+((R-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = IY+((YY-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = IY+((B-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
#else // much simpler code from Francois Ostiguy:
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX += dw * (XX-IX)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = R + dw * (R-IX)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = YY + dh*(YY-IY)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = B + dh*(B-IY)/(IB-IY);
#endif
      o->resize(XX+dx, YY+dy, R-XX, B-YY);
    }
  }
}